

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excp_helper.c
# Opt level: O2

void helper_msgclr_ppc64(CPUPPCState_conflict2 *env,target_ulong rb)

{
  byte bVar1;
  uint uVar2;
  
  uVar2 = 0xe;
  if (0x7ffffff < (uint)rb) {
    uVar2 = -(uint)(((uint)rb & 0xf8000000) != 0x8000000) | 0xd;
  }
  if (-1 < (int)uVar2) {
    bVar1 = (byte)uVar2 & 0x1f;
    env->pending_interrupts = env->pending_interrupts & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
  }
  return;
}

Assistant:

static int dbell2irq(target_ulong rb)
{
    int msg = rb & DBELL_TYPE_MASK;
    int irq = -1;

    switch (msg) {
    case DBELL_TYPE_DBELL:
        irq = PPC_INTERRUPT_DOORBELL;
        break;
    case DBELL_TYPE_DBELL_CRIT:
        irq = PPC_INTERRUPT_CDOORBELL;
        break;
    case DBELL_TYPE_G_DBELL:
    case DBELL_TYPE_G_DBELL_CRIT:
    case DBELL_TYPE_G_DBELL_MC:
        /* XXX implement */
    default:
        break;
    }

    return irq;
}